

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_list.c
# Opt level: O3

int qc_list_inserttail(QcList *list,void *data)

{
  uint *puVar1;
  QcListEntry *pQVar2;
  QcListEntry *pQVar3;
  undefined8 *extraout_RDX;
  int iVar4;
  void *pvVar5;
  QcList *pQVar6;
  QcList *pQVar7;
  
  if (list == (QcList *)0x0) {
    qc_list_inserttail_cold_3();
    pvVar5 = data;
    pQVar6 = list;
LAB_00105246:
    qc_list_inserttail_cold_2();
  }
  else {
    pvVar5 = data;
    pQVar6 = list;
    if (data == (void *)0x0) goto LAB_00105246;
    pQVar6 = (QcList *)0x1;
    pvVar5 = (void *)0x18;
    pQVar2 = (QcListEntry *)calloc(1,0x18);
    if (pQVar2 != (QcListEntry *)0x0) {
      pQVar2->data = data;
      pQVar6 = (QcList *)list->tail;
      pQVar2->prev = (QcListEntry *)pQVar6;
      if (pQVar6 == (QcList *)0x0) {
        pQVar6 = list;
      }
      pQVar6->head = pQVar2;
      list->tail = pQVar2;
      list->count = list->count + 1;
      return 0;
    }
  }
  qc_list_inserttail_cold_1();
  if (pQVar6 == (QcList *)0x0) {
    qc_list_inserttail2_cold_3();
    pQVar7 = pQVar6;
  }
  else {
    pQVar7 = pQVar6;
    if (pvVar5 != (void *)0x0) {
      pQVar7 = (QcList *)0x1;
      pQVar2 = (QcListEntry *)calloc(1,0x18);
      if (pQVar2 != (QcListEntry *)0x0) {
        pQVar2->data = pvVar5;
        pQVar7 = (QcList *)pQVar6->tail;
        pQVar2->prev = (QcListEntry *)pQVar7;
        if (pQVar7 == (QcList *)0x0) {
          pQVar7 = pQVar6;
        }
        pQVar7->head = pQVar2;
        pQVar6->tail = pQVar2;
        pQVar6->count = pQVar6->count + 1;
        *extraout_RDX = pQVar2;
        return 0;
      }
      goto LAB_001052af;
    }
  }
  qc_list_inserttail2_cold_2();
LAB_001052af:
  qc_list_inserttail2_cold_1();
  if (pQVar7 != (QcList *)0x0) {
    pQVar2 = pQVar7->head;
    if (pQVar2 == (QcListEntry *)0x0) {
      iVar4 = 0;
    }
    else {
      pQVar3 = pQVar2->next;
      if (pQVar7->cur == pQVar2) {
        pQVar7->cur = pQVar3;
      }
      pQVar7->head = pQVar3;
      if (pQVar3 != (QcListEntry *)0x0) {
        pQVar3->prev = (QcListEntry *)0x0;
      }
      puVar1 = &pQVar7->count;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        pQVar7->tail = (QcListEntry *)0x0;
      }
      iVar4 = (int)pQVar2->data;
      free(pQVar2);
    }
    return iVar4;
  }
  qc_list_pophead_cold_1();
  if (pQVar7 != (QcList *)0x0) {
    if (pQVar7->head == (QcListEntry *)0x0) {
      iVar4 = 0;
    }
    else {
      pQVar2 = pQVar7->tail;
      if (pQVar7->cur == pQVar2) {
        pQVar7->cur = (QcListEntry *)0x0;
      }
      if (pQVar2 == pQVar7->head) {
        pQVar7->head = (QcListEntry *)0x0;
        pQVar3 = pQVar2->prev;
      }
      else {
        pQVar3 = pQVar2->prev;
        pQVar3->next = (QcListEntry *)0x0;
      }
      pQVar7->tail = pQVar3;
      pQVar7->count = pQVar7->count - 1;
      iVar4 = (int)pQVar2->data;
      free(pQVar2);
    }
    return iVar4;
  }
  qc_list_poptail_cold_1();
  pQVar7->cur = pQVar7->head;
  return (int)pQVar7->head;
}

Assistant:

int	qc_list_inserttail(QcList *list, void *data)
{
    QcListEntry *entry;

    qc_assert(list);
    qc_assert(data);

    qc_malloc(entry, sizeof(struct __QcListEntry));
    if(!entry)
    {
        return -1;
    }

    entry->data = data;
    entry->next = NULL;

    entry->prev = list->tail;

    if(!list->tail)
    {
        list->head = entry;
    }
    else
    {
        list->tail->next = entry;
    }

    list->tail = entry;
    list->count++;
    
    return 0;
}